

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

PragmaInstr * IR::PragmaInstr::New(OpCode opcode,uint32 index,Func *func)

{
  undefined1 *puVar1;
  PragmaInstr *this;
  
  this = (PragmaInstr *)new<Memory::JitArenaAllocator>(0x60,func->m_alloc,0x3eba5c);
  (this->super_Instr).m_noLazyHelperAssert = false;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  (this->super_Instr).highlight = 0;
  puVar1 = &(this->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_Instr).field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014d55d0;
  this->m_statementIndex = 0;
  Instr::Init((Instr *)this,opcode,InstrKindPragma,func);
  this->m_statementIndex = index;
  return this;
}

Assistant:

PragmaInstr *
PragmaInstr::New(Js::OpCode opcode, uint32 index, Func *func)
{
    PragmaInstr * pragmaInstr;

    pragmaInstr = JitAnew(func->m_alloc, IR::PragmaInstr);
    pragmaInstr->Init(opcode, InstrKindPragma, func);
    pragmaInstr->m_statementIndex = index;

    return pragmaInstr;
}